

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O3

void lws_hex_from_byte_array(uint8_t *src,size_t slen,char *dest,size_t len)

{
  byte bVar1;
  char *pcVar2;
  long lVar3;
  char *pcVar4;
  bool bVar5;
  
  pcVar2 = dest + (len - 1);
  pcVar4 = dest;
  if (pcVar2 != dest && slen != 0) {
    lVar3 = slen - 1;
    do {
      bVar1 = *src;
      *dest = "0123456789abcdef"[bVar1 >> 4];
      pcVar4 = pcVar2;
      if (dest + 1 == pcVar2) break;
      dest[1] = "0123456789abcdef"[bVar1 & 0xf];
      pcVar4 = dest + 2;
      bVar5 = lVar3 == 0;
      lVar3 = lVar3 + -1;
      if (bVar5) break;
      src = src + 1;
      dest = dest + 2;
    } while (dest != pcVar2);
  }
  *pcVar4 = '\0';
  return;
}

Assistant:

void
lws_hex_from_byte_array(const uint8_t *src, size_t slen, char *dest, size_t len)
{
	char *end = &dest[len - 1];

	while (slen-- && dest != end) {
		uint8_t b = *src++;
		*dest++ = hexch[b >> 4];
		if (dest == end)
			break;
		*dest++ = hexch[b & 0xf];
	}

	*dest = '\0';
}